

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

void error_report(Location *location,string *message)

{
  int iVar1;
  char *text_00;
  ostream *this;
  int offset;
  char *text;
  int lineno;
  string *message_local;
  Location *location_local;
  
  error_count = error_count + 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::at(&srcfile_abi_cxx11_,(long)(location->line + -1));
  text_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = fprintf(_stderr,"\n%s (%d): ",location->unit,(ulong)(uint)location->line);
  fprintf(_stderr,"%s\n",text_00);
  underline(iVar1 + -1,location->first_column,location->last_column,text_00);
  fprintf(_stderr,"\nERROR!\t");
  this = std::operator<<((ostream *)&std::cerr,(string *)message);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void error_report(ast::Location *location, std::string message)
{
	error_count++;
	int lineno =  location->line - 1;
	const char *text = srcfile.at(lineno).c_str();
	auto offset = fprintf(stderr, "\n%s (%d): ", location->unit, location->line) - 1;
	fprintf(stderr, "%s\n", text);
	underline(offset, location->first_column, location->last_column, text);
	fprintf(stderr, "\nERROR!\t");
	std::cerr << message << std::endl;
}